

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O0

void __thiscall
ScriptBuilder_ScriptStackByOperator_Test::TestBody(ScriptBuilder_ScriptStackByOperator_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_1b8;
  Message local_1b0;
  string local_1a8;
  undefined1 local_188 [8];
  AssertionResult gtest_ar;
  Script script;
  ScriptBuilder builder;
  Script script1;
  string local_e0;
  Pubkey local_c0;
  allocator local_a1;
  string local_a0;
  ByteData local_80;
  undefined1 local_68 [8];
  ScriptBuilder build1;
  allocator local_31;
  undefined1 local_30 [8];
  string exp_hex;
  ScriptBuilder_ScriptStackByOperator_Test *this_local;
  
  exp_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "4c6a47304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01210229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,
             "304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01"
             ,&local_a1);
  cfd::core::ByteData::ByteData(&local_80,&local_a0);
  cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)local_68,&local_80);
  cfd::core::ByteData::~ByteData(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e0,
             "0229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551",
             (allocator *)
             ((long)&script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey(&local_c0,&local_e0);
  cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)local_68,&local_c0);
  cfd::core::Pubkey::~Pubkey(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ScriptBuilder::Build
            ((Script *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ScriptBuilder *)local_68);
  cfd::core::ScriptBuilder::ScriptBuilder
            ((ScriptBuilder *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::operator<<
            ((ScriptBuilder *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Script *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::Build
            ((Script *)&gtest_ar.message_,
             (ScriptBuilder *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::GetHex_abi_cxx11_(&local_1a8,(Script *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_188,"exp_hex","script.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x14f,message);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  cfd::core::Script::~Script((Script *)&gtest_ar.message_);
  cfd::core::ScriptBuilder::~ScriptBuilder
            ((ScriptBuilder *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &builder.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_68);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ScriptBuilder, ScriptStackByOperator) {
  std::string exp_hex = "4c6a47304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01210229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551";

  ScriptBuilder build1;
  build1 << ByteData("304402205a2f94921f645669b2b4e073da43e6a5d32335b50207f9d27f0e8a8c0a24e75902205dea52d27ad747f2df786e0ad737595cf9c5a489143170668399764a5b4be44a01");
  build1 << Pubkey("0229e026bab56c1c41d16e67f084362aef204b5b7ea08dafc2fb2e0db89d9c9551");
  auto script1 = build1.Build();

  ScriptBuilder builder;
  builder << script1;
  auto script = builder.Build();
  EXPECT_EQ(exp_hex, script.GetHex());
}